

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int ffwritehisto(long totaln,long pixoffset,long firstn,long nvalues,int narrays,
                iteratorCol *imagepars,void *userPointer)

{
  uint uVar1;
  void *pvVar2;
  int status;
  int local_14;
  
  local_14 = 0;
  uVar1 = *(int *)((long)userPointer + 0x24) - 0x15;
  if (((uVar1 < 0x3e) && ((0x2000000000200401U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
     (*(int *)((long)userPointer + 0x24) == 0xb)) {
    pvVar2 = fits_iter_get_array(imagepars);
    *(void **)userPointer = pvVar2;
  }
  ffiter(*(int *)((long)userPointer + 0x114),*(iteratorCol **)((long)userPointer + 0x118),0,0,
         ffcalchist,userPointer,&local_14);
  return local_14;
}

Assistant:

int ffwritehisto(long totaln, long pixoffset, long firstn, long nvalues,
		 int narrays, iteratorCol *imagepars, void *userPointer)
/*
   Interator work function that writes out the histogram.
   The histogram values are calculated by another work function, ffcalchisto.
   This work function only gets called once, and totaln = nvalues.
*/
{
    iteratorCol *colpars;
    int ii, status = 0, ncols;
    long rows_per_loop = 0, offset = 0;
    histType *histData;

    histData = (histType *)userPointer;

    /* store pointer to the histogram array, and initialize to zero */

    switch( histData->himagetype ) {
    case TBYTE:
       histData->hist.b = (char *  ) fits_iter_get_array(imagepars);
       break;
    case TSHORT:
       histData->hist.i = (short * ) fits_iter_get_array(imagepars);
       break;
    case TINT:
       histData->hist.j = (int *   ) fits_iter_get_array(imagepars);
       break;
    case TFLOAT:
       histData->hist.r = (float * ) fits_iter_get_array(imagepars);
       break;
    case TDOUBLE:
       histData->hist.d = (double *) fits_iter_get_array(imagepars);
       break;
    }

    /* call iterator function to calc the histogram pixel values */

    /* must lock this call in multithreaded environoments because */
    /* the ffcalchist work routine uses static vaiables that would */
    /* get clobbered if multiple threads were running at the same time */
    fits_iterate_data(histData->numIterCols, histData->iterCols,
		      offset, rows_per_loop,
		      ffcalchist, (void*)histData, &status);

    return(status);
}